

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.h
# Opt level: O3

void __thiscall SGParser::Generator::Production::Production(Production *this,Production *source)

{
  _Rb_tree_header *p_Var1;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  this->ErrorTerminal = 0;
  p_Var1 = &(this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header;
  (this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->Id = 0;
  this->Precedence = 0;
  this->Left = 0;
  this->Length = 0;
  this->pRight = (uint *)0x0;
  this->Line = 0;
  this->NotReported = false;
  (this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->ConflictActions)._M_t._M_impl.super__Rb_tree_header;
  (this->ConflictActions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConflictActions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ReduceOverrides)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->LeftChain).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LeftChain).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LeftChain).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ConflictActions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConflictActions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->ConflictActions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  operator=(this,source);
  return;
}

Assistant:

Production(const Production& source) {
        pRight = nullptr;
        *this  = source;
    }